

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

Instr * __thiscall
Lowerer::LowerProfiledNewArray(Lowerer *this,JitProfilingInstr *instr,bool hasArgs)

{
  code *pcVar1;
  bool bVar2;
  int32 iVar3;
  Instr *pIVar4;
  undefined4 *puVar5;
  AddrOpnd *dst;
  IntConstOpnd *pIVar6;
  RegOpnd *opndArg;
  Opnd *opndArg_00;
  HelperCallOpnd *newSrc;
  int32 argCount;
  bool isSpreadCall;
  Instr *startMarkerInstr;
  bool hasArgs_local;
  JitProfilingInstr *instr_local;
  Lowerer *this_local;
  
  pIVar4 = InsertLoweredRegionStartMarker(this,&instr->super_Instr);
  if (((byte)instr->field_0x60 >> 2 & 1) == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x1155,"(instr->isNewArray)","instr->isNewArray");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  if (instr->arrayProfileId == 0xffff) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x1156,"(instr->arrayProfileId != Js::Constants::NoProfileId)",
                       "instr->arrayProfileId != Js::Constants::NoProfileId");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  if (instr->profileId == 0xffff) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x1157,"(instr->profileId != Js::Constants::NoProfileId)",
                       "instr->profileId != Js::Constants::NoProfileId");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  bVar2 = true;
  if ((instr->super_Instr).m_opcode != NewScObjectSpread) {
    bVar2 = (instr->super_Instr).m_opcode == NewScObjArraySpread;
  }
  dst = IR::AddrOpnd::New((Var)0x0,AddrOpndKindConstantVar,this->m_func,true,(Var)0x0);
  LowererMD::LoadNewScObjFirstArg
            (&this->m_lowererMD,&instr->super_Instr,&dst->super_Opnd,(ushort)bVar2);
  if (bVar2 == false) {
    iVar3 = LowererMD::LowerCallArgs(&this->m_lowererMD,&instr->super_Instr,1,4);
    pIVar6 = IR::Opnd::CreateProfileIdOpnd(instr->arrayProfileId,this->m_func);
    LowererMD::LoadHelperArgument(&this->m_lowererMD,&instr->super_Instr,&pIVar6->super_Opnd);
    pIVar6 = IR::Opnd::CreateProfileIdOpnd(instr->profileId,this->m_func);
    LowererMD::LoadHelperArgument(&this->m_lowererMD,&instr->super_Instr,&pIVar6->super_Opnd);
    opndArg = IR::Opnd::CreateFramePointerOpnd(this->m_func);
    LowererMD::LoadHelperArgument(&this->m_lowererMD,&instr->super_Instr,&opndArg->super_Opnd);
    opndArg_00 = IR::Instr::UnlinkSrc1(&instr->super_Instr);
    LowererMD::LoadHelperArgument(&this->m_lowererMD,&instr->super_Instr,opndArg_00);
    newSrc = IR::HelperCallOpnd::New(HelperProfiledNewScObjArray,this->m_func);
    IR::Instr::SetSrc1(&instr->super_Instr,&newSrc->super_Opnd);
    LowererMD::LowerCall(&this->m_lowererMD,&instr->super_Instr,(ArgSlot)iVar3);
  }
  else {
    LowerSpreadCall(this,&instr->super_Instr,CallFlags_New,true);
  }
  pIVar4 = RemoveLoweredRegionStartMarker(this,pIVar4);
  return pIVar4;
}

Assistant:

IR::Instr* Lowerer::LowerProfiledNewArray(IR::JitProfilingInstr* instr, bool hasArgs)
{
    // Use the special helper which checks whether Array has been overwritten by the user and if
    //   it hasn't, possibly allocates a native array

    // Insert a temporary label before the instruction we're about to lower, so that we can return
    // the first instruction above that needs to be lowered after we're done - regardless of argument
    // list, StartCall, etc.
    IR::Instr* startMarkerInstr = InsertLoweredRegionStartMarker(instr);

    Assert(instr->isNewArray);
    Assert(instr->arrayProfileId != Js::Constants::NoProfileId);
    Assert(instr->profileId != Js::Constants::NoProfileId);

    bool isSpreadCall = instr->m_opcode == Js::OpCode::NewScObjectSpread || instr->m_opcode == Js::OpCode::NewScObjArraySpread;

    m_lowererMD.LoadNewScObjFirstArg(instr, IR::AddrOpnd::New(nullptr, IR::AddrOpndKindConstantVar, m_func, true), isSpreadCall ? 1 : 0);

    if (isSpreadCall)
    {
        this->LowerSpreadCall(instr, Js::CallFlags_New, true);
    }
    else
    {
        const int32 argCount = m_lowererMD.LowerCallArgs(instr, Js::CallFlags_New, 4);

        m_lowererMD.LoadHelperArgument(instr, IR::Opnd::CreateProfileIdOpnd(instr->arrayProfileId, m_func));
        m_lowererMD.LoadHelperArgument(instr, IR::Opnd::CreateProfileIdOpnd(instr->profileId, m_func));
        m_lowererMD.LoadHelperArgument(instr, IR::Opnd::CreateFramePointerOpnd(m_func));
        m_lowererMD.LoadHelperArgument(instr, instr->UnlinkSrc1());

        instr->SetSrc1(IR::HelperCallOpnd::New(IR::HelperProfiledNewScObjArray, m_func));
        m_lowererMD.LowerCall(instr, static_cast<Js::ArgSlot>(argCount));
    }

    return RemoveLoweredRegionStartMarker(startMarkerInstr);
}